

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void av1_pack_tile_info(AV1_COMP *cpi,ThreadData_conflict *td,PackBSParams *pack_bs_params)

{
  int col;
  uint uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  int iVar4;
  uchar *mem;
  TileInfo tile_info;
  aom_writer mode_bc;
  TileInfo local_80;
  aom_writer local_68;
  
  iVar4 = pack_bs_params->tile_row;
  col = pack_bs_params->tile_col;
  puVar2 = pack_bs_params->total_size;
  av1_tile_set_col(&local_80,&cpi->common,col);
  av1_tile_set_row(&local_80,&cpi->common,iVar4);
  local_68.allow_update_cdf = (cpi->common).features.disable_cdf_update ^ 1;
  av1_reset_loop_restoration
            (&(td->mb).e_mbd,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  puVar3 = pack_bs_params->dst;
  uVar1 = *puVar2;
  (pack_bs_params->buf).data = puVar3 + uVar1;
  if (pack_bs_params->is_last_tile_in_tg == 0) {
    *puVar2 = uVar1 + 4;
  }
  aom_start_encode(&local_68,puVar3 + *puVar2);
  write_modes(cpi,td,&local_80,&local_68,iVar4,col);
  iVar4 = aom_stop_encode(&local_68);
  if (iVar4 < 0) {
    aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_ERROR,"Error writing modes");
  }
  (pack_bs_params->buf).size = (ulong)local_68.pos;
  if (pack_bs_params->is_last_tile_in_tg == 0) {
    *(uint *)(pack_bs_params->buf).data = local_68.pos - 1;
  }
  return;
}

Assistant:

void av1_pack_tile_info(AV1_COMP *const cpi, ThreadData *const td,
                        PackBSParams *const pack_bs_params) {
  aom_writer mode_bc;
  AV1_COMMON *const cm = &cpi->common;
  int tile_row = pack_bs_params->tile_row;
  int tile_col = pack_bs_params->tile_col;
  uint32_t *const total_size = pack_bs_params->total_size;
  TileInfo tile_info;
  av1_tile_set_col(&tile_info, cm, tile_col);
  av1_tile_set_row(&tile_info, cm, tile_row);
  mode_bc.allow_update_cdf = 1;
  mode_bc.allow_update_cdf =
      mode_bc.allow_update_cdf && !cm->features.disable_cdf_update;

  unsigned int tile_size;

  const int num_planes = av1_num_planes(cm);
  av1_reset_loop_restoration(&td->mb.e_mbd, num_planes);

  pack_bs_params->buf.data = pack_bs_params->dst + *total_size;

  // The last tile of the tile group does not have a header.
  if (!pack_bs_params->is_last_tile_in_tg) *total_size += 4;

  // Pack tile data
  aom_start_encode(&mode_bc, pack_bs_params->dst + *total_size);
  write_modes(cpi, td, &tile_info, &mode_bc, tile_row, tile_col);
  if (aom_stop_encode(&mode_bc) < 0) {
    aom_internal_error(td->mb.e_mbd.error_info, AOM_CODEC_ERROR,
                       "Error writing modes");
  }
  tile_size = mode_bc.pos;
  assert(tile_size >= AV1_MIN_TILE_SIZE_BYTES);

  pack_bs_params->buf.size = tile_size;

  // Write tile size
  if (!pack_bs_params->is_last_tile_in_tg) {
    // size of this tile
    mem_put_le32(pack_bs_params->buf.data, tile_size - AV1_MIN_TILE_SIZE_BYTES);
  }
}